

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLibTests_Parsing.c
# Opt level: O0

WJTL_STATUS
VerifyJsonParsesAsListOfNumbers
          (_Bool IsJson5,char *Json,uint64_t *NumberArray,size_t NumberArrayCount)

{
  JL_STATUS JVar1;
  JL_DATA_TYPE JVar2;
  uint32_t uVar3;
  bool bVar4;
  _Bool _result_10;
  _Bool _result_9;
  _Bool _result_8;
  _Bool _result_7;
  _Bool _result_6;
  uint64_t uStack_68;
  _Bool _result_5;
  uint64_t u64;
  size_t i;
  _Bool _result_4;
  _Bool _result_3;
  _Bool _result_2;
  _Bool _result_1;
  JlDataObject *pJStack_50;
  _Bool _result;
  JlDataObject *object;
  JlListItem *enumerator;
  size_t sStack_38;
  WJTL_STATUS TestReturn;
  size_t errorAtPos;
  JlDataObject *listObject;
  size_t NumberArrayCount_local;
  uint64_t *NumberArray_local;
  char *Json_local;
  _Bool IsJson5_local;
  
  errorAtPos = 0;
  sStack_38 = 100;
  enumerator._4_4_ = WJTL_STATUS_SUCCESS;
  object = (JlDataObject *)0x0;
  pJStack_50 = (JlDataObject *)0x0;
  listObject = (JlDataObject *)NumberArrayCount;
  NumberArrayCount_local = (size_t)NumberArray;
  NumberArray_local = (uint64_t *)Json;
  Json_local._7_1_ = IsJson5;
  JVar1 = JlParseJsonEx(Json,IsJson5,(JlDataObject **)&errorAtPos,&stack0xffffffffffffffc8);
  i._7_1_ = JVar1 == JL_STATUS_SUCCESS;
  WjTestLib_Assert((_Bool)i._7_1_,
                   "((JL_STATUS)(JlParseJsonEx( Json, IsJson5, &listObject, &errorAtPos ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"VerifyJsonParsesAsListOfNumbers",0x20d);
  if ((i._7_1_ & 1) == 0) {
    enumerator._4_4_ = WJTL_STATUS_FAILED;
  }
  if (enumerator._4_4_ == WJTL_STATUS_SUCCESS) {
    i._6_1_ = errorAtPos != 0;
    WjTestLib_Assert((_Bool)i._6_1_,"(listObject) != NULL",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"VerifyJsonParsesAsListOfNumbers",0x210);
    if ((i._6_1_ & 1) == 0) {
      enumerator._4_4_ = WJTL_STATUS_FAILED;
    }
    JVar2 = JlGetObjectType((JlDataObject *)errorAtPos);
    i._5_1_ = JVar2 == JL_DATA_TYPE_LIST;
    WjTestLib_Assert((_Bool)i._5_1_,"JlGetObjectType( listObject ) == JL_DATA_TYPE_LIST",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"VerifyJsonParsesAsListOfNumbers",0x211);
    if ((i._5_1_ & 1) == 0) {
      enumerator._4_4_ = WJTL_STATUS_FAILED;
    }
    i._4_1_ = sStack_38 == 0;
    WjTestLib_Assert((_Bool)i._4_1_,"errorAtPos == 0",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"VerifyJsonParsesAsListOfNumbers",0x212);
    if ((i._4_1_ & 1) == 0) {
      enumerator._4_4_ = WJTL_STATUS_FAILED;
    }
    uVar3 = JlGetListCount((JlDataObject *)errorAtPos);
    i._3_1_ = (JlDataObject *)(ulong)uVar3 == listObject;
    WjTestLib_Assert((_Bool)i._3_1_,"JlGetListCount( listObject ) == NumberArrayCount",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"VerifyJsonParsesAsListOfNumbers",0x214);
    if ((i._3_1_ & 1) == 0) {
      enumerator._4_4_ = WJTL_STATUS_FAILED;
    }
    object = (JlDataObject *)0x0;
    for (u64 = 0; u64 < listObject; u64 = u64 + 1) {
      uStack_68 = 0xffffffffffffffff;
      pJStack_50 = (JlDataObject *)0x0;
      JVar1 = JlGetObjectListNextItem
                        ((JlDataObject *)errorAtPos,&stack0xffffffffffffffb0,(JlListItem **)&object)
      ;
      WjTestLib_Assert(JVar1 == JL_STATUS_SUCCESS,
                       "((JL_STATUS)(JlGetObjectListNextItem( listObject, &object, &enumerator ))) == (JL_STATUS_SUCCESS)"
                       ,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                       ,"VerifyJsonParsesAsListOfNumbers",0x21c);
      if (JVar1 != JL_STATUS_SUCCESS) {
        enumerator._4_4_ = WJTL_STATUS_FAILED;
      }
      bVar4 = pJStack_50 != (JlDataObject *)0x0;
      WjTestLib_Assert(bVar4,"(object) != NULL",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                       ,"VerifyJsonParsesAsListOfNumbers",0x21d);
      if (!bVar4) {
        enumerator._4_4_ = WJTL_STATUS_FAILED;
      }
      JVar1 = JlGetObjectNumberU64(pJStack_50,&stack0xffffffffffffff98);
      WjTestLib_Assert(JVar1 == JL_STATUS_SUCCESS,
                       "((JL_STATUS)(JlGetObjectNumberU64( object, &u64 ))) == (JL_STATUS_SUCCESS)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                       ,"VerifyJsonParsesAsListOfNumbers",0x21e);
      if (JVar1 != JL_STATUS_SUCCESS) {
        enumerator._4_4_ = WJTL_STATUS_FAILED;
      }
      bVar4 = uStack_68 == *(uint64_t *)(NumberArrayCount_local + u64 * 8);
      WjTestLib_Assert(bVar4,"u64 == NumberArray[i]",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                       ,"VerifyJsonParsesAsListOfNumbers",0x21f);
      if (!bVar4) {
        enumerator._4_4_ = WJTL_STATUS_FAILED;
      }
    }
    JVar1 = JlGetObjectListNextItem
                      ((JlDataObject *)errorAtPos,&stack0xffffffffffffffb0,(JlListItem **)&object);
    WjTestLib_Assert(JVar1 == JL_STATUS_END_OF_DATA,
                     "(JlGetObjectListNextItem( listObject, &object, &enumerator )) == (JL_STATUS_END_OF_DATA)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"VerifyJsonParsesAsListOfNumbers",0x223);
    if (JVar1 != JL_STATUS_END_OF_DATA) {
      enumerator._4_4_ = WJTL_STATUS_FAILED;
    }
    JVar1 = JlFreeObjectTree((JlDataObject **)&errorAtPos);
    WjTestLib_Assert(JVar1 == JL_STATUS_SUCCESS,
                     "((JL_STATUS)(JlFreeObjectTree( &listObject ))) == (JL_STATUS_SUCCESS)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"VerifyJsonParsesAsListOfNumbers",0x226);
    if (JVar1 != JL_STATUS_SUCCESS) {
      enumerator._4_4_ = WJTL_STATUS_FAILED;
    }
  }
  return enumerator._4_4_;
}

Assistant:

static
WJTL_STATUS
    VerifyJsonParsesAsListOfNumbers
    (
        bool            IsJson5,
        char const*     Json,
        uint64_t*       NumberArray,
        size_t          NumberArrayCount
    )
{
    JlDataObject*   listObject = NULL;
    size_t          errorAtPos = 100;
    WJTL_STATUS     TestReturn = WJTL_STATUS_SUCCESS;
    JlListItem*     enumerator = NULL;
    JlDataObject*   object = NULL;

    JL_ASSERT_SUCCESS( JlParseJsonEx( Json, IsJson5, &listObject, &errorAtPos ) );
    if( WJTL_STATUS_SUCCESS == TestReturn )
    {
        JL_ASSERT_NOT_NULL( listObject );
        JL_ASSERT( JlGetObjectType( listObject ) == JL_DATA_TYPE_LIST );
        JL_ASSERT( errorAtPos == 0 );

        JL_ASSERT( JlGetListCount( listObject ) == NumberArrayCount );

        // Verify all elements in list match array
        enumerator = NULL;
        for( size_t i=0; i<NumberArrayCount; i++ )
        {
            uint64_t u64 = UINT64_MAX;
            object = NULL;
            JL_ASSERT_SUCCESS( JlGetObjectListNextItem( listObject, &object, &enumerator ) );
            JL_ASSERT_NOT_NULL( object );
            JL_ASSERT_SUCCESS( JlGetObjectNumberU64( object, &u64 ) );
            JL_ASSERT( u64 == NumberArray[i] );
        }

        // Verify there are no more items in the list
        JL_ASSERT_STATUS( JlGetObjectListNextItem( listObject, &object, &enumerator ), JL_STATUS_END_OF_DATA );

        // Clean up
        JL_ASSERT_SUCCESS( JlFreeObjectTree( &listObject ) );
    }

    return TestReturn;
}